

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_population(REF_AGENTS ref_agents,char *context)

{
  REF_MPI ref_mpi_00;
  void *value;
  ulong uVar1;
  uint local_44;
  REF_INT total;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT *counts;
  REF_INT id;
  REF_MPI ref_mpi;
  char *context_local;
  REF_AGENTS ref_agents_local;
  
  ref_mpi_00 = ref_agents->ref_mpi;
  value = malloc(0x20);
  if (value == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x62,
           "ref_agents_population","malloc counts of REF_INT NULL");
    ref_agents_local._4_4_ = 2;
  }
  else {
    for (total = 0; total < 8; total = total + 1) {
      *(undefined4 *)((long)value + (long)total * 4) = 0;
    }
    for (counts._4_4_ = 0; (int)counts._4_4_ < ref_agents->max; counts._4_4_ = counts._4_4_ + 1) {
      if (REF_AGENT_NEW < ref_agents->agent[(int)counts._4_4_].mode) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               0x65,"ref_agents_population","last");
        return 1;
      }
      uVar1 = (ulong)ref_agents->agent[(int)counts._4_4_].mode;
      *(int *)((long)value + uVar1 * 4) = *(int *)((long)value + uVar1 * 4) + 1;
    }
    ref_agents_local._4_4_ = ref_mpi_allsum(ref_mpi_00,value,8,1);
    if (ref_agents_local._4_4_ == 0) {
      if (ref_mpi_00->id == 0) {
        local_44 = 0;
        for (counts._4_4_ = 1; (int)counts._4_4_ < 8; counts._4_4_ = counts._4_4_ + 1) {
          local_44 = *(int *)((long)value + (long)(int)counts._4_4_ * 4) + local_44;
        }
        printf(" %5d of",(ulong)local_44);
        for (counts._4_4_ = 1; (int)counts._4_4_ < 8; counts._4_4_ = counts._4_4_ + 1) {
          printf(" %d:%4d",(ulong)counts._4_4_,
                 (ulong)*(uint *)((long)value + (long)(int)counts._4_4_ * 4));
        }
        printf(" %s\n",context);
      }
      if (value != (void *)0x0) {
        free(value);
      }
      ref_agents_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x68
             ,"ref_agents_population",(ulong)ref_agents_local._4_4_,"as");
    }
  }
  return ref_agents_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_agents_population(REF_AGENTS ref_agents,
                                         const char *context) {
  REF_MPI ref_mpi = ref_agents->ref_mpi;
  REF_INT id, *counts;
  ref_malloc_init(counts, REF_AGENT_MODE_LAST, REF_INT, 0);
  for (id = 0; id < ref_agents->max; id++) {
    RAS(0 <= ref_agent_mode(ref_agents, id), "last");
    RAS(REF_AGENT_MODE_LAST > ref_agent_mode(ref_agents, id), "last");
    counts[ref_agent_mode(ref_agents, id)]++;
  }
  RSS(ref_mpi_allsum(ref_mpi, counts, REF_AGENT_MODE_LAST, REF_INT_TYPE), "as");
  if (ref_mpi_once(ref_mpi)) {
    REF_INT total = 0;
    for (id = 1; id < REF_AGENT_MODE_LAST; id++) total += counts[id];
    printf(" %5d of", total);
    for (id = 1; id < REF_AGENT_MODE_LAST; id++)
      printf(" %d:%4d", id, counts[id]);
    printf(" %s\n", context);
  }
  ref_free(counts);
  return REF_SUCCESS;
}